

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                    sqlite3_value **apVal)

{
  Fts3Table *p_00;
  uint uVar1;
  int iVar2;
  sqlite3_vtab *psVar3;
  uchar *z;
  char *pcVar4;
  char *zQuery;
  int iCol;
  int iIdx;
  sqlite3_value *pDocidLe;
  sqlite3_value *pDocidGe;
  sqlite3_value *pLangid;
  sqlite3_value *pCons;
  Fts3Cursor *pCsr;
  Fts3Table *p;
  char *pcStack_48;
  int eSearch;
  char *zSql;
  int rc;
  sqlite3_value **apVal_local;
  int nVal_local;
  char *idxStr_local;
  int idxNum_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  p_00 = (Fts3Table *)pCursor->pVtab;
  pLangid = (sqlite3_value *)0x0;
  pDocidGe = (sqlite3_value *)0x0;
  pDocidLe = (sqlite3_value *)0x0;
  _iCol = (sqlite3_value *)0x0;
  uVar1 = idxNum & 0xffff;
  if (uVar1 != 0) {
    pLangid = *apVal;
  }
  zQuery._4_4_ = (uint)(uVar1 != 0);
  if ((idxNum & 0x10000U) != 0) {
    pDocidGe = apVal[(int)zQuery._4_4_];
    zQuery._4_4_ = zQuery._4_4_ + 1;
  }
  if ((idxNum & 0x20000U) != 0) {
    pDocidLe = apVal[(int)zQuery._4_4_];
    zQuery._4_4_ = zQuery._4_4_ + 1;
  }
  if ((idxNum & 0x40000U) != 0) {
    _iCol = apVal[(int)zQuery._4_4_];
  }
  fts3ClearCursor((Fts3Cursor *)pCursor);
  psVar3 = (sqlite3_vtab *)fts3DocidRange(pDocidLe,-0x8000000000000000);
  pCursor[0xc].pVtab = psVar3;
  psVar3 = (sqlite3_vtab *)fts3DocidRange(_iCol,0x7fffffffffffffff);
  pCursor[0xd].pVtab = psVar3;
  if (idxStr == (char *)0x0) {
    *(u8 *)((long)&pCursor[9].pVtab + 4) = p_00->bDescIdx;
  }
  else {
    *(bool *)((long)&pCursor[9].pVtab + 4) = *idxStr == 'D';
  }
  *(short *)&pCursor[1].pVtab = (short)idxNum;
  if ((uVar1 != 1) && (uVar1 != 0)) {
    z = sqlite3_value_text(pLangid);
    if ((z == (uchar *)0x0) && (iVar2 = sqlite3_value_type(pLangid), iVar2 != 5)) {
      return 7;
    }
    *(undefined4 *)&pCursor[4].pVtab = 0;
    if (pDocidGe != (sqlite3_value *)0x0) {
      iVar2 = sqlite3_value_int(pDocidGe);
      *(int *)&pCursor[4].pVtab = iVar2;
    }
    iVar2 = sqlite3Fts3ExprParse
                      (p_00->pTokenizer,*(int *)&pCursor[4].pVtab,p_00->azColumn,(uint)p_00->bFts4,
                       p_00->nColumn,uVar1 - 2,(char *)z,-1,(Fts3Expr **)(pCursor + 3),
                       &(p_00->base).zErrMsg);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = fts3EvalStart((Fts3Cursor *)pCursor);
    sqlite3Fts3SegmentsClose(p_00);
    if (iVar2 != 0) {
      return iVar2;
    }
    pCursor[7].pVtab = pCursor[8].pVtab;
    pCursor[6].pVtab = (sqlite3_vtab *)0x0;
  }
  zSql._4_4_ = 0;
  if (uVar1 == 0) {
    if ((pDocidLe == (sqlite3_value *)0x0) && (_iCol == (sqlite3_value *)0x0)) {
      pcVar4 = "ASC";
      if (*(char *)((long)&pCursor[9].pVtab + 4) != '\0') {
        pcVar4 = "DESC";
      }
      pcStack_48 = sqlite3_mprintf("SELECT %s ORDER BY rowid %s",p_00->zReadExprlist,pcVar4);
    }
    else {
      pcVar4 = "ASC";
      if (*(char *)((long)&pCursor[9].pVtab + 4) != '\0') {
        pcVar4 = "DESC";
      }
      pcStack_48 = sqlite3_mprintf("SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
                                   p_00->zReadExprlist,pCursor[0xc].pVtab,pCursor[0xd].pVtab,pcVar4)
      ;
    }
    if (pcStack_48 == (char *)0x0) {
      zSql._4_4_ = 7;
    }
    else {
      zSql._4_4_ = sqlite3_prepare_v3(p_00->db,pcStack_48,-1,1,(sqlite3_stmt **)(pCursor + 2),
                                      (char **)0x0);
      sqlite3_free(pcStack_48);
    }
  }
  else if ((uVar1 == 1) && (zSql._4_4_ = fts3CursorSeekStmt((Fts3Cursor *)pCursor), zSql._4_4_ == 0)
          ) {
    zSql._4_4_ = sqlite3_bind_value((sqlite3_stmt *)pCursor[2].pVtab,1,pLangid);
  }
  if (zSql._4_4_ == 0) {
    pCursor_local._4_4_ = fts3NextMethod(pCursor);
  }
  else {
    pCursor_local._4_4_ = zSql._4_4_;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int fts3FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_OK;
  char *zSql;                     /* SQL statement used to access %_content */
  int eSearch;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;

  sqlite3_value *pCons = 0;       /* The MATCH or rowid constraint, if any */
  sqlite3_value *pLangid = 0;     /* The "langid = ?" constraint, if any */
  sqlite3_value *pDocidGe = 0;    /* The "docid >= ?" constraint, if any */
  sqlite3_value *pDocidLe = 0;    /* The "docid <= ?" constraint, if any */
  int iIdx;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  eSearch = (idxNum & 0x0000FFFF);
  assert( eSearch>=0 && eSearch<=(FTS3_FULLTEXT_SEARCH+p->nColumn) );
  assert( p->pSegments==0 );

  /* Collect arguments into local variables */
  iIdx = 0;
  if( eSearch!=FTS3_FULLSCAN_SEARCH ) pCons = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_LANGID ) pLangid = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_GE ) pDocidGe = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_LE ) pDocidLe = apVal[iIdx++];
  assert( iIdx==nVal );

  /* In case the cursor has been used before, clear it now. */
  fts3ClearCursor(pCsr);

  /* Set the lower and upper bounds on docids to return */
  pCsr->iMinDocid = fts3DocidRange(pDocidGe, SMALLEST_INT64);
  pCsr->iMaxDocid = fts3DocidRange(pDocidLe, LARGEST_INT64);

  if( idxStr ){
    pCsr->bDesc = (idxStr[0]=='D');
  }else{
    pCsr->bDesc = p->bDescIdx;
  }
  pCsr->eSearch = (i16)eSearch;

  if( eSearch!=FTS3_DOCID_SEARCH && eSearch!=FTS3_FULLSCAN_SEARCH ){
    int iCol = eSearch-FTS3_FULLTEXT_SEARCH;
    const char *zQuery = (const char *)sqlite3_value_text(pCons);

    if( zQuery==0 && sqlite3_value_type(pCons)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }

    pCsr->iLangid = 0;
    if( pLangid ) pCsr->iLangid = sqlite3_value_int(pLangid);

    assert( p->base.zErrMsg==0 );
    rc = sqlite3Fts3ExprParse(p->pTokenizer, pCsr->iLangid,
        p->azColumn, p->bFts4, p->nColumn, iCol, zQuery, -1, &pCsr->pExpr, 
        &p->base.zErrMsg
    );
    if( rc!=SQLITE_OK ){
      return rc;
    }

    rc = fts3EvalStart(pCsr);
    sqlite3Fts3SegmentsClose(p);
    if( rc!=SQLITE_OK ) return rc;
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }

  /* Compile a SELECT statement for this cursor. For a full-table-scan, the
  ** statement loops through all rows of the %_content table. For a
  ** full-text query or docid lookup, the statement retrieves a single
  ** row by docid.
  */
  if( eSearch==FTS3_FULLSCAN_SEARCH ){
    if( pDocidGe || pDocidLe ){
      zSql = sqlite3_mprintf(
          "SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
          p->zReadExprlist, pCsr->iMinDocid, pCsr->iMaxDocid,
          (pCsr->bDesc ? "DESC" : "ASC")
      );
    }else{
      zSql = sqlite3_mprintf("SELECT %s ORDER BY rowid %s", 
          p->zReadExprlist, (pCsr->bDesc ? "DESC" : "ASC")
      );
    }
    if( zSql ){
      rc = sqlite3_prepare_v3(p->db,zSql,-1,SQLITE_PREPARE_PERSISTENT,&pCsr->pStmt,0);
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }else if( eSearch==FTS3_DOCID_SEARCH ){
    rc = fts3CursorSeekStmt(pCsr);
    if( rc==SQLITE_OK ){
      rc = sqlite3_bind_value(pCsr->pStmt, 1, pCons);
    }
  }
  if( rc!=SQLITE_OK ) return rc;

  return fts3NextMethod(pCursor);
}